

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_info.h
# Opt level: O2

bool pybind11::detail::compare_buffer_info<unsigned_long,_void>::compare(buffer_info *b)

{
  bool bVar1;
  bool bVar2;
  string *__lhs;
  
  if (b->itemsize == 8) {
    __lhs = &b->format;
    bVar1 = std::operator==(__lhs,"Q");
    bVar2 = true;
    if (!bVar1) {
      bVar1 = std::operator==(__lhs,"L");
      if (!bVar1) {
        bVar2 = std::operator==(__lhs,"N");
        return bVar2;
      }
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

static bool compare(const buffer_info& b) {
        return (size_t) b.itemsize == sizeof(T) && (b.format == format_descriptor<T>::value ||
            ((sizeof(T) == sizeof(long)) && b.format == (std::is_unsigned<T>::value ? "L" : "l")) ||
            ((sizeof(T) == sizeof(size_t)) && b.format == (std::is_unsigned<T>::value ? "N" : "n")));
    }